

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

LY_ERR lyd_dup_ctx_check(lyd_node *node,lyd_node_inner *parent)

{
  lysc_node *plVar1;
  lysc_node *plVar2;
  lyd_node_inner *plVar3;
  lys_module *plVar4;
  lyd_node_inner *plVar5;
  LY_ERR LVar6;
  lys_module *plVar7;
  
  LVar6 = LY_SUCCESS;
  if (parent != (lyd_node_inner *)0x0) {
    plVar1 = node->schema;
    if (plVar1 == (lysc_node *)0x0) {
      plVar4 = (lys_module *)&node[2].schema;
    }
    else {
      plVar4 = plVar1->module;
    }
    plVar2 = (parent->field_0).node.schema;
    if (plVar2 == (lysc_node *)0x0) {
      plVar7 = (lys_module *)&parent[1].field_0.node.priv;
    }
    else {
      plVar7 = plVar2->module;
    }
    LVar6 = LY_SUCCESS;
    if (plVar4->ctx != plVar7->ctx) {
      plVar5 = (lyd_node_inner *)node;
      if (node != (lyd_node *)0x0) {
        do {
          plVar3 = *(lyd_node_inner **)((long)&plVar5->field_0 + 0x10);
          if ((*(uint32_t *)((long)&plVar5->field_0 + 4) & 8) != 0) {
            if (plVar3 != (lyd_node_inner *)0x0) {
              plVar5 = (plVar5->field_0).node.parent;
              if ((plVar5->field_0).node.schema == (lysc_node *)0x0) {
                plVar4 = (lys_module *)&plVar5[1].field_0.node.priv;
              }
              else {
                plVar4 = ((plVar5->field_0).node.schema)->module;
              }
              if (plVar2 == (lysc_node *)0x0) {
                plVar7 = (lys_module *)&parent[1].field_0.node.priv;
              }
              else {
                plVar7 = plVar2->module;
              }
              if (plVar4->ctx == plVar7->ctx) {
                return LY_SUCCESS;
              }
            }
            break;
          }
          plVar5 = plVar3;
        } while (plVar3 != (lyd_node_inner *)0x0);
      }
      if (plVar1 == (lysc_node *)0x0) {
        plVar4 = (lys_module *)&node[2].schema;
      }
      else {
        plVar4 = plVar1->module;
      }
      LVar6 = LY_EINVAL;
      ly_log(plVar4->ctx,LY_LLERR,LY_EINVAL,"Different contexts used in node duplication.");
    }
  }
  return LVar6;
}

Assistant:

static LY_ERR
lyd_dup_ctx_check(const struct lyd_node *node, const struct lyd_node_inner *parent)
{
    const struct lyd_node *iter;

    if (!node || !parent) {
        return LY_SUCCESS;
    }

    if ((LYD_CTX(node) != LYD_CTX(parent))) {
        /* try to find top-level ext data parent */
        for (iter = node; iter && !(iter->flags & LYD_EXT); iter = lyd_parent(iter)) {}

        if (!iter || !lyd_parent(iter) || (LYD_CTX(lyd_parent(iter)) != LYD_CTX(parent))) {
            LOGERR(LYD_CTX(node), LY_EINVAL, "Different contexts used in node duplication.");
            return LY_EINVAL;
        }
    }

    return LY_SUCCESS;
}